

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_type_segment_info(type_segment sec)

{
  type_pointer pfVar1;
  char *pcVar2;
  uint local_2c;
  uint local_28;
  int j_1;
  int j;
  int i;
  type_pointer type_segment_addr;
  type_segment sec_local;
  
  for (j_1 = 0; j_1 < sec.type_segment_count; j_1 = j_1 + 1) {
    pfVar1 = sec.type_segment_addr + j_1;
    printf("  - type[%d]:",(ulong)(uint)j_1);
    printf("(");
    for (local_28 = 0; local_28 < pfVar1->param_count; local_28 = local_28 + 1) {
      if (local_28 != 0) {
        printf(",");
      }
      pcVar2 = val_type(pfVar1->param_types[(int)local_28]);
      printf("%s",pcVar2);
    }
    printf(")->(");
    for (local_2c = 0; local_2c < pfVar1->return_count; local_2c = local_2c + 1) {
      if (local_2c != 0) {
        printf(",");
      }
      pcVar2 = val_type(pfVar1->return_types[(int)local_2c]);
      printf("%s",pcVar2);
    }
    printf(")\n");
  }
  return;
}

Assistant:

void print_type_segment_info(type_segment sec) {
    type_pointer type_segment_addr;
    for (int i = 0; i < sec.type_segment_count; ++i) {
        type_segment_addr = sec.type_segment_addr + i;
        printf("  - type[%d]:", i);
        printf("(");
        for (int j = 0; j < type_segment_addr->param_count; ++j) {
            if (j)printf(",");
            printf("%s", val_type(*(type_segment_addr->param_types + j)));
        }
        printf(")->(");
        for (int j = 0; j < type_segment_addr->return_count; ++j) {
            if (j)printf(",");
            printf("%s", val_type(*(type_segment_addr->return_types + j)));
        }
        printf(")\n");
    }
}